

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O1

tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
binary::uvarint_abi_cxx11_
          (tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,binary *this,Bytes *buf)

{
  long lVar1;
  long lVar2;
  allocator_type local_39;
  uint local_38;
  uint local_34;
  void *local_30 [2];
  long local_20;
  
  binUvarint((binary *)&local_38,(Bytes *)this);
  if ((ulong)local_38 == 0) {
    *(undefined1 **)
     &(__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_head_impl.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         = (undefined1 *)
           ((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_head_impl.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           + 0x10);
    lVar1 = DAT_0014c768;
    lVar2 = multihash::errVarIntBufferTooShort_abi_cxx11_;
  }
  else {
    if (-1 < (int)local_38) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_30,
                 (uchar *)((ulong)local_38 + *(long *)this),
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )*(uchar **)(this + 8),&local_39);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
                 (vector<unsigned_char,std::allocator<unsigned_char>> *)local_30);
      if (local_30[0] != (void *)0x0) {
        operator_delete(local_30[0],local_20 - (long)local_30[0]);
      }
      *(bool *)((long)&(__return_storage_ptr__->
                       super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                       ._M_head_impl.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               + 0x20) = false;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = local_34;
      return __return_storage_ptr__;
    }
    *(undefined1 **)
     &(__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_head_impl.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         = (undefined1 *)
           ((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_head_impl.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           + 0x10);
    lVar1 = DAT_0014c788;
    lVar2 = multihash::errVarIntTooLong_abi_cxx11_;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,lVar2,lVar1 + lVar2);
  *(bool *)((long)&(__return_storage_ptr__->
                   super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<1UL,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_head_impl.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           + 0x20) = true;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = 0;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<UInt, OptError> uvarint(Bytes &buf) {
	auto [n, c] = binUvarint(buf);
	if (c == 0) {
		return {0, errVarIntBufferTooShort};
	}
	if (c < 0) {
		return {0, errVarIntTooLong};
	}
	buf = Bytes{buf.begin() + c, buf.end()};
	return {n, std::nullopt};
}